

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

size_t wabt::ReadS32Leb128(uint8_t *p,uint8_t *end,uint32_t *out_value)

{
  bool bVar1;
  uint32_t result_4;
  int top_bits;
  bool sign_bit_set;
  uint32_t result_3;
  uint32_t result_2;
  uint32_t result_1;
  uint32_t result;
  uint32_t *out_value_local;
  uint8_t *end_local;
  uint8_t *p_local;
  
  if ((p < end) && ((*p & 0x80) == 0)) {
    *out_value = (int)((uint)*p << 0x19) >> 0x19;
    p_local = &DAT_00000001;
  }
  else if ((p + 1 < end) && ((p[1] & 0x80) == 0)) {
    *out_value = (int)(((p[1] & 0x7f) << 7 | *p & 0x7f) << 0x12) >> 0x12;
    p_local = (uint8_t *)0x2;
  }
  else if ((p + 2 < end) && ((p[2] & 0x80) == 0)) {
    *out_value = (int)(((p[2] & 0x7f) << 0xe | (p[1] & 0x7f) << 7 | *p & 0x7f) << 0xb) >> 0xb;
    p_local = (uint8_t *)0x3;
  }
  else if ((p + 3 < end) && ((p[3] & 0x80) == 0)) {
    *out_value = (int)(((p[3] & 0x7f) << 0x15 |
                       (p[2] & 0x7f) << 0xe | (p[1] & 0x7f) << 7 | *p & 0x7f) << 4) >> 4;
    p_local = &DAT_00000004;
  }
  else if ((p + 4 < end) && ((p[4] & 0x80) == 0)) {
    bVar1 = (p[4] & 8) != 0;
    if (((bVar1) && ((p[4] & 0xf0) != 0x70)) || ((!bVar1 && ((p[4] & 0xf0) != 0)))) {
      p_local = (uint8_t *)0x0;
    }
    else {
      *out_value = (uint)p[4] << 0x1c |
                   (p[3] & 0x7f) << 0x15 | (p[2] & 0x7f) << 0xe | (p[1] & 0x7f) << 7 | *p & 0x7f;
      p_local = (uint8_t *)0x5;
    }
  }
  else {
    p_local = (uint8_t *)0x0;
  }
  return (size_t)p_local;
}

Assistant:

size_t ReadS32Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint32_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    uint32_t result = LEB128_1(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 6);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    uint32_t result = LEB128_2(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 13);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    uint32_t result = LEB128_3(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 20);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    uint32_t result = LEB128_4(uint32_t);
    *out_value = SIGN_EXTEND(int32_t, result, 27);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    // The top bits should be a sign-extension of the sign bit.
    bool sign_bit_set = (p[4] & 0x8);
    int top_bits = p[4] & 0xf0;
    if ((sign_bit_set && top_bits != 0x70) ||
        (!sign_bit_set && top_bits != 0)) {
      return 0;
    }
    uint32_t result = LEB128_5(uint32_t);
    *out_value = result;
    return 5;
  } else {
    // Past the end.
    return 0;
  }
}